

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PA3Application.cpp
# Opt level: O3

void PA3Application::resize(GLFWwindow *window,int framebufferWidth,int framebufferHeight)

{
  undefined1 auVar1 [16];
  void *pvVar2;
  float fVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  float fVar8;
  undefined1 auVar6 [16];
  
  pvVar2 = glfwGetWindowUserPointer(window);
  fVar3 = (float)framebufferHeight / (float)framebufferWidth;
  if (fVar3 <= 1.0) {
    auVar5._4_4_ = fVar3;
    auVar5._0_4_ = fVar3;
    auVar5._8_4_ = fVar3;
    auVar5._12_4_ = fVar3;
    auVar5 = divps(ZEXT816(0xbf8000003f800000),auVar5);
    fVar3 = auVar5._4_4_;
    fVar8 = auVar5._0_4_ - fVar3;
    auVar7._0_8_ = (undefined8)DAT_00175760;
    auVar7._8_4_ = DAT_00175760._4_4_;
    auVar7._12_4_ = -fVar3;
    auVar6._8_8_ = auVar7._8_8_;
    auVar6._0_8_ = CONCAT44(fVar3 + auVar5._0_4_,(int)DAT_00175760) ^ 0x8000000000000000;
    auVar1._4_4_ = fVar8;
    auVar1._0_4_ = fVar8;
    auVar1._8_4_ = fVar8;
    auVar1._12_4_ = fVar8;
    auVar5 = divps(auVar6,auVar1);
    uVar4 = auVar5._0_8_;
    fVar3 = -0.0;
    fVar8 = 1.0;
  }
  else {
    fVar8 = 2.0 / (fVar3 + fVar3);
    fVar3 = -(fVar3 - fVar3) / (fVar3 + fVar3);
    uVar4 = 0x800000003f800000;
  }
  *(int *)((long)pvVar2 + 0x30) = (int)uVar4;
  *(undefined8 *)((long)pvVar2 + 0x34) = 0;
  *(undefined8 *)((long)pvVar2 + 0x3c) = 0;
  *(undefined8 *)((long)pvVar2 + 0x48) = 0;
  *(undefined8 *)((long)pvVar2 + 0x50) = 0;
  *(float *)((long)pvVar2 + 0x44) = fVar8;
  *(undefined8 *)((long)pvVar2 + 0x58) = 0x3f800000;
  *(int *)((long)pvVar2 + 0x60) = (int)((ulong)uVar4 >> 0x20);
  *(float *)((long)pvVar2 + 100) = fVar3;
  *(undefined8 *)((long)pvVar2 + 0x68) = 0x3f80000000000000;
  glViewport(0,0,framebufferWidth,framebufferHeight);
  return;
}

Assistant:

void PA3Application::resize(GLFWwindow * window, int framebufferWidth, int framebufferHeight)
{
  PA3Application & app = *static_cast<PA3Application *>(glfwGetWindowUserPointer(window));
  float aspect = framebufferHeight / float(framebufferWidth);
  if (aspect > 1) {
    app.m_proj = glm::ortho(-1.f, 1.f, -aspect, aspect);
  } else {
    app.m_proj = glm::ortho(-1 / aspect, 1 / aspect, -1.f, 1.f);
  }
  glViewport(0, 0, framebufferWidth, framebufferHeight);
}